

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O1

Box * __thiscall amrex::MFIter::tilebox(Box *__return_storage_ptr__,MFIter *this,IntVect *nodal)

{
  pointer pBVar1;
  IntVect *pIVar2;
  int iVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int i;
  long lVar8;
  uint uVar9;
  Box bx;
  int local_4c [2];
  undefined8 uStack_44;
  Box local_34;
  
  iVar3 = this->currentIndex;
  pBVar4 = (this->tile_array->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = pBVar4 + iVar3;
  uVar5 = *(undefined8 *)(pBVar1->smallend).vect;
  uVar6 = *(undefined8 *)((long)(pBVar1->smallend).vect + 8);
  pIVar2 = &pBVar4[iVar3].bigend;
  uVar7 = *(undefined8 *)((long)pIVar2->vect + 8);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)pIVar2->vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar7;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar5;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar6;
  uVar9 = (uint)(nodal->vect[2] != 0) << 2 |
          (uint)(nodal->vect[0] != 0) + (uint)(nodal->vect[1] != 0) * 2;
  if (uVar9 != 0) {
    (__return_storage_ptr__->btype).itype = uVar9;
    BATransformer::operator()
              (&local_34,&(this->fabArray->boxarray).m_bat,
               (Box *)((long)(this->index_map->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar3] * 0x1c +
                      *(long *)&(((this->fabArray->boxarray).m_ref.
                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data));
    uStack_44._0_4_ = local_34.bigend.vect[2];
    uStack_44._4_4_ = local_34.btype.itype;
    lVar8 = 0;
    do {
      if ((uStack_44._4_4_ >> ((uint)lVar8 & 0x1f) & 1) != 0) {
        local_4c[lVar8] = local_4c[lVar8] + -1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    uStack_44 = uStack_44 & 0xffffffff;
    lVar8 = 0;
    do {
      if (((uVar9 >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
         (iVar3 = (__return_storage_ptr__->bigend).vect[lVar8], iVar3 == local_4c[lVar8])) {
        (__return_storage_ptr__->bigend).vect[lVar8] = iVar3 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Box
MFIter::tilebox (const IntVect& nodal) const noexcept
{
    BL_ASSERT(tile_array != 0);
    Box bx((*tile_array)[currentIndex]);
    const IndexType new_typ {nodal};
    if (! new_typ.cellCentered())
    {
        bx.setType(new_typ);
        const Box& valid_cc_box = amrex::enclosedCells(validbox());
        const IntVect& Big = valid_cc_box.bigEnd();
        for (int d=0; d<AMREX_SPACEDIM; ++d) {
            if (new_typ.nodeCentered(d)) { // validbox should also be nodal in d-direction.
                if (bx.bigEnd(d) == Big[d]) {
                    bx.growHi(d,1);
                }
            }
        }
    }
    return bx;
}